

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::BasicUsageCS::Run(BasicUsageCS *this)

{
  bool bVar1;
  GLuint GVar2;
  ContextInfo *pCVar3;
  undefined4 *puVar4;
  uint local_88c;
  uint local_888;
  int i;
  GLuint data [512];
  uint *ptr;
  string local_78;
  char *local_58;
  char *glsl_cs;
  allocator<char> local_39;
  string local_38;
  BasicUsageCS *local_18;
  BasicUsageCS *this_local;
  
  local_18 = this;
  pCVar3 = deqp::Context::getContextInfo
                     ((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_ARB_compute_shader");
  if (bVar1) {
    pCVar3 = deqp::Context::getContextInfo
                       ((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_ARB_shader_storage_buffer_object");
    if (bVar1) {
      local_58 = 
      "\nlayout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter_dec;\nlayout(std430) buffer Output {\n  uint data_inc[256];\n  uint data_dec[256];\n} g_out;\nvoid main() {\n  uint offset = 32 * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);\n  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);\n}"
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,
                 "\nlayout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;\nlayout(binding = 0, offset = 4) uniform atomic_uint ac_counter_dec;\nlayout(std430) buffer Output {\n  uint data_inc[256];\n  uint data_dec[256];\n} g_out;\nvoid main() {\n  uint offset = 32 * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);\n  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);\n}"
                 ,(allocator<char> *)((long)&ptr + 7));
      GVar2 = CreateComputeProgram(this,&local_78);
      this->prog_ = GVar2;
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ptr + 7));
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->prog_);
      bVar1 = CheckProgram(this,this->prog_,(bool *)0x0);
      if (!bVar1) {
        this_local = (BasicUsageCS *)&DAT_ffffffffffffffff;
        return (long)this_local;
      }
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->counter_buffer_);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,0,this->counter_buffer_);
      glu::CallLogWrapper::glBufferData
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,8,(void *)0x0,0x88ea);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,0);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,this->counter_buffer_);
      puVar4 = (undefined4 *)
               glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper,0x92c0,0,8,10);
      *puVar4 = 0;
      data._2040_8_ = puVar4 + 2;
      puVar4[1] = 0x100;
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0);
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_buffer);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x800,(void *)0x0,0x88e8);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->prog_);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,4,1,1);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_buffer);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,0x800,&local_888);
      std::sort<unsigned_int*>(&local_888,data + 0x1fe);
      local_88c = 0;
      while( true ) {
        if (0x1ff < (int)local_88c) {
          return 0;
        }
        if ((&local_888)[(int)local_88c] != (&local_888)[(int)(local_88c + 1)]) break;
        if (((int)local_88c < 0x1fe) &&
           ((&local_888)[(int)local_88c] == (&local_888)[(int)(local_88c + 2)])) {
          gl4cts::anon_unknown_0::Output
                    ("Too many same values found: %d, index: %d\n",
                     (ulong)(&local_888)[(int)local_88c],(ulong)local_88c);
          this_local = (BasicUsageCS *)&DAT_ffffffffffffffff;
          return (long)this_local;
        }
        local_88c = local_88c + 2;
      }
      gl4cts::anon_unknown_0::Output
                ("Pair of values should be equal, got: %d, %d\n",(ulong)(&local_888)[(int)local_88c]
                 ,(ulong)(&local_888)[(int)(local_88c + 1)]);
      this_local = (BasicUsageCS *)&DAT_ffffffffffffffff;
      return (long)this_local;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_ARB_shader_storage_buffer_object or GL_ARB_compute_shader not supported",&local_39)
  ;
  deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return 0;
}

Assistant:

virtual long Run()
	{

		if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_compute_shader") ||
			!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_storage_buffer_object"))
		{
			OutputNotSupported("GL_ARB_shader_storage_buffer_object or GL_ARB_compute_shader not supported");
			return NO_ERROR;
		}

		// create program
		const char* const glsl_cs =
			NL "layout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;" NL
			   "layout(binding = 0, offset = 0) uniform atomic_uint ac_counter_inc;" NL
			   "layout(binding = 0, offset = 4) uniform atomic_uint ac_counter_dec;" NL
			   "layout(std430) buffer Output {" NL "  uint data_inc[256];" NL "  uint data_dec[256];" NL "} g_out;" NL
			   "void main() {" NL "  uint offset = 32 * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;" NL
			   "  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter_inc);" NL
			   "  g_out.data_dec[offset] = atomicCounterDecrement(ac_counter_dec);" NL "}";
		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;

		// create atomic counter buffer
		glGenBuffers(1, &counter_buffer_);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		unsigned int* ptr = static_cast<unsigned int*>(
			glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 8, GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT));
		*ptr++ = 0;
		*ptr++ = 256;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 512 * sizeof(GLuint), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(prog_);
		glDispatchCompute(4, 1, 1);

		GLuint data[512];
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, 512 * sizeof(GLuint), &data[0]);

		std::sort(data, data + 512);
		for (int i = 0; i < 512; i += 2)
		{
			if (data[i] != data[i + 1])
			{
				Output("Pair of values should be equal, got: %d, %d\n", data[i], data[i + 1]);
				return ERROR;
			}
			if (i < 510 && data[i] == data[i + 2])
			{
				Output("Too many same values found: %d, index: %d\n", data[i], i);
				return ERROR;
			}
		}

		return NO_ERROR;
	}